

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
vkt::shaderexecutor::PrecisionTestContext::PrecisionTestContext
          (PrecisionTestContext *this,TestContext *testCtx_,FloatFormat *highp_,
          FloatFormat *mediump_,FloatFormat *lowp_,
          vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *shaderTypes_,int numRandoms_)

{
  vector<glu::ShaderType,_std::allocator<glu::ShaderType>_> *shaderTypes__local;
  FloatFormat *lowp__local;
  FloatFormat *mediump__local;
  FloatFormat *highp__local;
  TestContext *testCtx__local;
  PrecisionTestContext *this_local;
  
  this->testCtx = testCtx_;
  std::vector<glu::ShaderType,_std::allocator<glu::ShaderType>_>::vector
            (&this->shaderTypes,shaderTypes_);
  this->numRandoms = numRandoms_;
  this->formats[2] = highp_;
  this->formats[1] = mediump_;
  this->formats[0] = lowp_;
  return;
}

Assistant:

PrecisionTestContext	(TestContext&				testCtx_,
													 const FloatFormat&			highp_,
													 const FloatFormat&			mediump_,
													 const FloatFormat&			lowp_,
													 const vector<ShaderType>&	shaderTypes_,
													 int						numRandoms_)
								: testCtx				(testCtx_)
								, shaderTypes			(shaderTypes_)
								, numRandoms			(numRandoms_)
								{
									formats[glu::PRECISION_HIGHP]	= &highp_;
									formats[glu::PRECISION_MEDIUMP]	= &mediump_;
									formats[glu::PRECISION_LOWP]	= &lowp_;
								}